

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O3

void __thiscall
ElementsAddressFactory_GetConfidentialAddress_Test::
~ElementsAddressFactory_GetConfidentialAddress_Test
          (ElementsAddressFactory_GetConfidentialAddress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetConfidentialAddress)
{
  ConfidentialKey pubkey = ConfidentialKey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    Address address("ex1q7s3nr3qcaaz30wnyfttwnlyedqddgwfhclhncc", GetElementsAddressFormatList());
    ElementsConfidentialAddress conf_address = ElementsAddressFactory::GetConfidentialAddress(address, pubkey);

    EXPECT_STREQ(conf_address.GetConfidentialKey().GetHex().c_str(), pubkey.GetHex().c_str());
    EXPECT_STREQ(conf_address.GetUnblindedAddress().GetAddress().c_str(), address.GetAddress().c_str());
  }
  {
    Address address("XRpicZNrFZumBMhRV5BSYW28pGX7JyY1ua", GetElementsAddressFormatList());
    ElementsConfidentialAddress conf_address = ElementsAddressFactory::GetConfidentialAddress(address, pubkey);

    EXPECT_STREQ(conf_address.GetConfidentialKey().GetHex().c_str(), pubkey.GetHex().c_str());
    EXPECT_STREQ(conf_address.GetUnblindedAddress().GetAddress().c_str(), address.GetAddress().c_str());
  }

  // error
  Address err_address("bcrt1qjylqhy5pm2ck75ppqxk5ue2swsuk7dx9mmfljp");
  EXPECT_THROW(ElementsAddressFactory::GetConfidentialAddress(err_address, pubkey), CfdException);
  Address err_address2("2NDBYYaMywkXcQ4cupdKQdoyrm9iHHSLtdy");
  EXPECT_THROW(ElementsAddressFactory::GetConfidentialAddress(err_address2, pubkey), CfdException);
}